

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int base64encode(char *encoded,char *string,int len)

{
  char cVar1;
  int iVar2;
  char *p;
  long lVar3;
  uint uVar4;
  
  iVar2 = (int)encoded;
  for (lVar3 = 0; lVar3 < len + -2; lVar3 = lVar3 + 3) {
    *encoded = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(byte)string[lVar3] >> 2];
    encoded[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(uint)((byte)string[lVar3 + 1] >> 4) | ((byte)string[lVar3] & 3) << 4];
    encoded[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(uint)((byte)string[lVar3 + 2] >> 6) + ((byte)string[lVar3 + 1] & 0xf) * 4];
    encoded[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(byte)string[lVar3 + 2] & 0x3f];
    encoded = encoded + 4;
  }
  if ((int)lVar3 < len) {
    *encoded = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(byte)string[lVar3] >> 2];
    uVar4 = ((byte)string[lVar3] & 3) << 4;
    if (len + -1 == (int)lVar3) {
      encoded[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar4];
      cVar1 = '=';
    }
    else {
      encoded[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(byte)((byte)uVar4 | (byte)string[lVar3 + 1] >> 4)];
      cVar1 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [(ulong)((byte)string[lVar3 + 1] & 0xf) * 4];
    }
    encoded[2] = cVar1;
    encoded[3] = '=';
    encoded = encoded + 4;
  }
  *encoded = '\0';
  return ((int)encoded - iVar2) + 1;
}

Assistant:

int base64encode(char *encoded, const char *string, int len)
{
    int i;
    char *p;

    p = encoded;
    for (i = 0; i < len - 2; i += 3)
    {
        *p++ = basis_64[(string[i] >> 2) & 0x3F];
        *p++ = basis_64[((string[i] & 0x3) << 4) |
                        ((int)(string[i + 1] & 0xF0) >> 4)];
        *p++ = basis_64[((string[i + 1] & 0xF) << 2) |
                        ((int)(string[i + 2] & 0xC0) >> 6)];
        *p++ = basis_64[string[i + 2] & 0x3F];
    }
    if (i < len)
    {
        *p++ = basis_64[(string[i] >> 2) & 0x3F];
        if (i == (len - 1))
        {
            *p++ = basis_64[((string[i] & 0x3) << 4)];
            *p++ = '=';
        }
        else
        {
            *p++ = basis_64[((string[i] & 0x3) << 4) |
                            ((int)(string[i + 1] & 0xF0) >> 4)];
            *p++ = basis_64[((string[i + 1] & 0xF) << 2)];
        }
        *p++ = '=';
    }

    *p++ = '\0';
    return p - encoded;
}